

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

Stmt * __thiscall kratos::Stmt::stmt_parent(Stmt *this)

{
  IRNodeKind IVar1;
  int iVar2;
  undefined4 extraout_var;
  Stmt *local_38;
  uint local_24;
  Stmt *pSStack_20;
  uint32_t i;
  IRNode *pre;
  IRNode *p;
  Stmt *this_local;
  
  pre = this->parent_;
  local_24 = 0;
  pSStack_20 = this;
  while ((local_24 < 100000 && pre != (IRNode *)0x0 &&
         (IVar1 = IRNode::ir_node_kind(pre), IVar1 == StmtKind))) {
    pSStack_20 = (Stmt *)pre;
    iVar2 = (*pre->_vptr_IRNode[4])();
    pre = (IRNode *)CONCAT44(extraout_var,iVar2);
    local_24 = local_24 + 1;
  }
  if (pSStack_20 == (Stmt *)0x0) {
    local_38 = (Stmt *)0x0;
  }
  else {
    local_38 = (Stmt *)__dynamic_cast(pSStack_20,&IRNode::typeinfo,&typeinfo,0);
  }
  return local_38;
}

Assistant:

Stmt *Stmt::stmt_parent() const {
    const IRNode *p = parent_;
    const IRNode *pre = this;
    for (uint32_t i = 0; i < 100000u && p; i++) {
        if (p->ir_node_kind() == IRNodeKind::StmtKind) {
            pre = p;
            p = p->parent();
        } else {
            break;
        }
    }
    return dynamic_cast<Stmt *>(const_cast<IRNode *>(pre));
}